

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_utilities.h
# Opt level: O2

bool Gudhi::persistence_matrix::
     _multiply_target_and_add_to_column<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>,std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>>>>
               (Field_element *val,
               set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>,_std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>_>_>
               *source,Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
                       *targetColumn)

{
  bool bVar1;
  anon_class_1_0_00000001 local_51;
  anon_class_8_1_e4bd5e45 local_50;
  anon_class_16_2_6d7ca8c5 local_48;
  anon_class_16_2_6d7ca8c5 local_38;
  anon_class_16_2_6d7ca8c5 local_28;
  
  if (*val == 0) {
    Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_false>_>_>
    ::clear(targetColumn);
  }
  local_50.targetColumn = targetColumn;
  local_48.targetColumn = targetColumn;
  local_48.val = val;
  local_38.targetColumn = targetColumn;
  local_38.val = val;
  local_28.targetColumn = targetColumn;
  local_28.val = val;
  bVar1 = _generic_add_to_column<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>,std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>>>,Gudhi::persistence_matrix::_multiply_target_and_add_to_column<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>,std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>,std::less<Gudhi::persistence_matrix::____matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,false>>>*>&)_1_>
                    (source,targetColumn,&local_28,&local_50,&local_38,&local_51,&local_48);
  return bVar1;
}

Assistant:

bool _multiply_target_and_add_to_column(const typename Column::Field_element& val,
                                        const Entry_range& source,
                                        Column& targetColumn)
{
  if (val == 0u) {
    if constexpr (Column::Master::isNonBasic && !Column::Master::Option_list::is_of_boundary_type) {
      throw std::invalid_argument("A chain column should not be multiplied by 0.");
      // this would not only mess up the base, but also the pivots stored.
    } else {
      targetColumn.clear();
    }
  }

  return _generic_add_to_column(
      source,
      targetColumn,
      [&](typename Column::Entry* entryTarget) {
        targetColumn.operators_->multiply_inplace(entryTarget->get_element(), val);
        // targetColumn.RA_opt::update_entry(*itTarget) produces an internal compiler error
        // even though it works in _generic_add_to_column... Probably because of the lambda.
        if constexpr (Column::Master::Option_list::has_row_access) targetColumn.update_entry(*entryTarget);
      },
      [&](typename Entry_range::const_iterator& itSource, const typename Column::Column_support::iterator& itTarget) {
        targetColumn._insert_entry(itSource->get_element(), itSource->get_row_index(), itTarget);
      },
      [&](typename Column::Field_element& targetElement, typename Entry_range::const_iterator& itSource) {
        targetColumn.operators_->multiply_and_add_inplace_front(targetElement, val, itSource->get_element());
      },
      [&]([[maybe_unused]] typename Column::Entry* entryTarget) {},
      [&](typename Column::Column_support::iterator& itTarget) {
        while (itTarget != targetColumn.column_.end()) {
          typename Column::Entry* targetEntry = _get_entry<typename Column::Entry>(itTarget);
          targetColumn.operators_->multiply_inplace(targetEntry->get_element(), val);
          if constexpr (Column::Master::Option_list::has_row_access) targetColumn.update_entry(*targetEntry);
          itTarget++;
        }
      }
    );
}